

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

UInt32 * crnlib::GetMatchesSpec1
                   (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                   UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue,
                   UInt32 *distances,UInt32 maxLen)

{
  uint uVar1;
  UInt32 *pUVar2;
  UInt32 *pUVar3;
  uint local_80;
  UInt32 local_7c;
  uint local_6c;
  UInt32 len;
  Byte *pb;
  CLzRef *pair;
  uint local_50;
  UInt32 delta;
  UInt32 len1;
  UInt32 len0;
  CLzRef *ptr1;
  CLzRef *ptr0;
  UInt32 _cyclicBufferPos_local;
  CLzRef *son_local;
  Byte *cur_local;
  UInt32 local_18;
  UInt32 pos_local;
  UInt32 curMatch_local;
  UInt32 lenLimit_local;
  
  _len1 = son + (_cyclicBufferPos << 1);
  delta = 0;
  local_50 = 0;
  ptr1 = son + (ulong)(_cyclicBufferPos << 1) + 1;
  local_18 = curMatch;
  do {
    uVar1 = pos - local_18;
    if ((cutValue == 0) || (_cyclicBufferSize <= uVar1)) {
      *_len1 = 0;
      *ptr1 = 0;
      return distances;
    }
    if (_cyclicBufferPos < uVar1) {
      local_7c = _cyclicBufferSize;
    }
    else {
      local_7c = 0;
    }
    pUVar2 = son + ((_cyclicBufferPos - uVar1) + local_7c) * 2;
    if (delta < local_50) {
      local_80 = delta;
    }
    else {
      local_80 = local_50;
    }
    local_6c = local_80;
    if (cur[(ulong)local_80 - (ulong)uVar1] == cur[local_80]) {
      local_6c = local_80 + 1;
      if ((local_6c != lenLimit) && (cur[(ulong)local_6c - (ulong)uVar1] == cur[local_6c])) {
        do {
          local_6c = local_6c + 1;
          if (local_6c == lenLimit) break;
        } while (cur[(ulong)local_6c - (ulong)uVar1] == cur[local_6c]);
      }
      if (maxLen < local_6c) {
        maxLen = local_6c;
        pUVar3 = distances + 1;
        *distances = local_6c;
        distances = distances + 2;
        *pUVar3 = uVar1 - 1;
        if (local_6c == lenLimit) {
          *_len1 = *pUVar2;
          *ptr1 = pUVar2[1];
          return distances;
        }
      }
    }
    if (cur[(ulong)local_6c - (ulong)uVar1] < cur[local_6c]) {
      *_len1 = local_18;
      _len1 = pUVar2 + 1;
      local_18 = *_len1;
      local_50 = local_6c;
      cutValue = cutValue - 1;
    }
    else {
      *ptr1 = local_18;
      local_18 = *pUVar2;
      delta = local_6c;
      cutValue = cutValue - 1;
      ptr1 = pUVar2;
    }
  } while( true );
}

Assistant:

UInt32* GetMatchesSpec1(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                        UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue,
                        UInt32* distances, UInt32 maxLen) {
  CLzRef* ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef* ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize) {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return distances;
    }
    {
      CLzRef* pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte* pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len]) {
        if (++len != lenLimit && pb[len] == cur[len])
          while (++len != lenLimit)
            if (pb[len] != cur[len])
              break;
        if (maxLen < len) {
          *distances++ = maxLen = len;
          *distances++ = delta - 1;
          if (len == lenLimit) {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return distances;
          }
        }
      }
      if (pb[len] < cur[len]) {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      } else {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}